

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.c
# Opt level: O1

int SHA1_Final(uchar *md,SHA_CTX *c)

{
  uint uVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  uint8_t finalcount [8];
  undefined1 local_28 [8];
  
  bVar2 = 0;
  uVar4 = 0;
  do {
    local_28[uVar4] = (char)(c->data[(ulong)(uVar4 < 4) - 2] >> (~bVar2 & 0x18));
    uVar4 = uVar4 + 1;
    bVar2 = bVar2 + 8;
  } while (uVar4 != 8);
  SHA1_Update(c,anon_var_dwarf_53088,1);
  uVar1 = c->Nl;
  while ((uVar1 & 0x1f8) != 0x1c0) {
    SHA1_Update(c,"",1);
    uVar1 = c->Nl;
  }
  SHA1_Update(c,local_28,8);
  iVar3 = 0;
  uVar4 = 0;
  do {
    md[uVar4] = (uchar)(*(uint *)((long)c->data + ((uVar4 & 0xfffffffffffffffc) - 0x1c)) >>
                       (~(byte)iVar3 & 0x18));
    uVar4 = uVar4 + 1;
    iVar3 = iVar3 + 8;
  } while (uVar4 != 0x14);
  return iVar3;
}

Assistant:

void SHA1_Final(uint8_t digest[20], SHA1_CTX *context)
{
  size_t i;
  uint8_t finalcount[8];

  for (i = 0; i < 8; i++) {
    finalcount[i] = (uint8_t) ((context->count[(i >= 4 ? 0 : 1)]
                    >> ((3 - (i & 3)) * 8)) & 255); /* Endian independent */
  }
  SHA1_Update(context, (uint8_t *) "\x80", 1);
  while ((context->count[0] & 504) != 448)
    SHA1_Update(context, (uint8_t *) "\0", 1);
  SHA1_Update(context, finalcount, 8); /* Should cause a SHA1Transform() */
  for (i = 0; i < 20; i++) {
    digest[i] =
      (uint8_t)((context->state[i >> 2] >> ((3 - (i & 3)) * 8)) & 255);
  }
}